

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O3

void __thiscall xray_re::xr_reader::r_sz(xr_reader *this,string *value)

{
  uint8_t *puVar1;
  pointer pcVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  puVar1 = (this->field_2).m_p;
  puVar4 = this->m_end;
  puVar3 = puVar1;
  if (puVar4 <= puVar1) {
    __assert_fail("p < m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                  ,0x8b,"void xray_re::xr_reader::r_sz(std::string &)");
  }
  do {
    if (*puVar3 == '\0') {
      puVar4 = puVar3;
      puVar5 = puVar3 + 1;
      break;
    }
    puVar3 = puVar3 + 1;
    puVar5 = puVar4;
  } while (puVar3 != puVar4);
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_replace_dispatch<unsigned_char_const*>
            ((string *)value,pcVar2,pcVar2 + value->_M_string_length,puVar1,puVar4);
  (this->field_2).m_p = puVar5;
  return;
}

Assistant:

void xr_reader::r_sz(std::string& value)
{
	const uint8_t* p = m_p;
	xr_assert(p < m_end);
	while (*p++) {
		// FIXME: we should crash in debug mode if no '\0' in the chunk,
		// but that is not good for older models (from 2215).
		// update: OGF_S_LODS 
		// assert(p < m_end);
		if (p >= m_end) {
			value.assign(m_p, p);
			m_p = p;
			return;
		}
	}
	value.assign(m_p, p - 1);
	m_p = p;
}